

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPRequest.hpp
# Opt level: O2

ssize_t __thiscall http::Request::send(Request *this,int __fd,void *__buf,size_t __n,int __flags)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  undefined8 *puVar2;
  bool bVar3;
  _Alloc_hider _Var4;
  size_type sVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  ssize_t sVar10;
  vector<unsigned_char,std::allocator<unsigned_char>> *this_00;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  _Var11;
  size_type sVar12;
  long lVar13;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var14;
  ulong uVar15;
  ResponseError *this_01;
  RequestError *this_02;
  system_error *this_03;
  error_category *__ecat;
  socklen_t __len;
  string *header;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined4 in_register_00000034;
  InternetProtocol *pIVar16;
  char cVar17;
  undefined4 in_register_00000084;
  ulong uVar18;
  pointer __buf_00;
  uint8_t crlf [2];
  uint local_11b0;
  Socket socket;
  vector<unsigned_char,_std::allocator<unsigned_char>_> responseData;
  ulong local_1188;
  string headerValue;
  string line;
  unsigned_long local_1120;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  string local_10e8;
  unique_ptr<addrinfo,_void_(*)(addrinfo_*)> addressInfo;
  pointer local_10b8;
  pointer local_10b0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> requestData;
  addrinfo *info;
  string headerData;
  addrinfo hints;
  uint8_t tempBuffer [4096];
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __last;
  
  pIVar16 = (InternetProtocol *)CONCAT44(in_register_00000034,__fd);
  puVar2 = (undefined8 *)CONCAT44(in_register_00000084,__flags);
  bVar6 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (pIVar16 + 8),"http");
  if (bVar6) {
    this_02 = (RequestError *)__cxa_allocate_exception(0x10);
    RequestError::RequestError(this_02,"Only HTTP scheme is supported");
    __cxa_throw(this_02,&RequestError::typeinfo,std::logic_error::~logic_error);
  }
  hints.ai_canonname = (char *)0x0;
  hints.ai_next = (addrinfo *)0x0;
  hints.ai_addrlen = 0;
  hints._20_4_ = 0;
  hints.ai_addr = (sockaddr *)0x0;
  hints.ai_flags = 0;
  hints.ai_family = 0;
  hints.ai_socktype = 0;
  hints.ai_protocol = 0;
  iVar9 = detail::getAddressFamily(*pIVar16);
  hints.ai_family = iVar9;
  hints.ai_socktype = 1;
  iVar9 = getaddrinfo(*(char **)(pIVar16 + 0x28),*(char **)(pIVar16 + 0x48),(addrinfo *)&hints,
                      (addrinfo **)&info);
  if (iVar9 != 0) {
    this_03 = (system_error *)__cxa_allocate_exception(0x20);
    iVar9 = detail::getLastError();
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)tempBuffer,
                   "Failed to get address info of ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (pIVar16 + 0x28));
    __ecat = (error_category *)std::_V2::system_category();
    std::system_error::system_error(this_03,iVar9,__ecat,(string *)tempBuffer);
    __cxa_throw(this_03,&std::system_error::typeinfo,std::system_error::~system_error);
  }
  addressInfo._M_t.super___uniq_ptr_impl<addrinfo,_void_(*)(addrinfo_*)>._M_t.
  super__Tuple_impl<0UL,_addrinfo_*,_void_(*)(addrinfo_*)>.
  super__Tuple_impl<1UL,_void_(*)(addrinfo_*)>.super__Head_base<1UL,_void_(*)(addrinfo_*),_false>.
  _M_head_impl = (_Head_base<1UL,_void_(*)(addrinfo_*),_false>)freeaddrinfo;
  addressInfo._M_t.super___uniq_ptr_impl<addrinfo,_void_(*)(addrinfo_*)>._M_t.
  super__Tuple_impl<0UL,_addrinfo_*,_void_(*)(addrinfo_*)>.super__Head_base<0UL,_addrinfo_*,_false>.
  _M_head_impl = info;
  std::operator+(&line,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__buf,
                 " ");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)tempBuffer,
                 &line,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (pIVar16 + 0x68));
  std::operator+(&headerData,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)tempBuffer,
                 " HTTP/1.1\r\n");
  std::__cxx11::string::~string((string *)tempBuffer);
  std::__cxx11::string::~string((string *)&line);
  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)puVar2[1];
  for (__lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar2;
      __lhs != pbVar1; __lhs = __lhs + 1) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)tempBuffer,
                   __lhs,"\r\n");
    std::__cxx11::string::append((string *)&headerData);
    std::__cxx11::string::~string((string *)tempBuffer);
  }
  std::operator+(&headerValue,"Host: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (pIVar16 + 0x28));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&parts,
                 &headerValue,"\r\nContent-Length: ");
  std::__cxx11::to_string(&local_10e8,*(long *)(__n + 8) - *(long *)__n);
  std::operator+(&line,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&parts,
                 &local_10e8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)tempBuffer,
                 &line,"\r\n\r\n");
  std::__cxx11::string::append((string *)&headerData);
  std::__cxx11::string::~string((string *)tempBuffer);
  std::__cxx11::string::~string((string *)&line);
  std::__cxx11::string::~string((string *)&local_10e8);
  std::__cxx11::string::~string((string *)&parts);
  std::__cxx11::string::~string((string *)&headerValue);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&requestData,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )headerData._M_dataplus._M_p,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(headerData._M_dataplus._M_p + headerData._M_string_length),
             (allocator_type *)tempBuffer);
  __last._M_current = *(uchar **)(__n + 8);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&requestData,
             (const_iterator)
             requestData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )*(uchar **)__n,__last);
  __len = (socklen_t)__last._M_current;
  detail::Socket::Socket(&socket,*pIVar16);
  detail::Socket::connect
            (&socket,(int)(addressInfo._M_t.super___uniq_ptr_impl<addrinfo,_void_(*)(addrinfo_*)>.
                           _M_t.super__Tuple_impl<0UL,_addrinfo_*,_void_(*)(addrinfo_*)>.
                           super__Head_base<0UL,_addrinfo_*,_false>._M_head_impl)->ai_addr,
             (sockaddr *)
             (ulong)(addressInfo._M_t.super___uniq_ptr_impl<addrinfo,_void_(*)(addrinfo_*)>._M_t.
                     super__Tuple_impl<0UL,_addrinfo_*,_void_(*)(addrinfo_*)>.
                     super__Head_base<0UL,_addrinfo_*,_false>._M_head_impl)->ai_addrlen,__len);
  __buf_00 = requestData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish +
             -(long)requestData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
  for (; __buf_00 != (pointer)0x0; __buf_00 = __buf_00 + -sVar10) {
    sVar10 = detail::Socket::send
                       (&socket,(int)requestData.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start,__buf_00,0x4000,
                        __flags);
    requestData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         requestData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start + sVar10;
  }
  crlf[0] = '\r';
  crlf[1] = '\n';
  *(undefined4 *)this = 0;
  (this->scheme)._M_dataplus._M_p = (pointer)0x0;
  (this->scheme)._M_string_length = 0;
  (this->scheme).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(this->scheme).field_2 + 8) = 0;
  responseData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->domain)._M_dataplus._M_p = (pointer)0x0;
  (this->domain)._M_string_length = 0;
  responseData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  responseData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this_00 = (vector<unsigned_char,std::allocator<unsigned_char>> *)
            ((this->scheme).field_2._M_local_buf + 8);
  bVar7 = true;
  local_1188 = 0;
  local_11b0 = 0;
  bVar6 = false;
  local_1120 = 0;
  bVar8 = false;
  bVar3 = false;
LAB_0014a8b6:
  do {
    do {
      sVar10 = detail::Socket::recv(&socket,(int)tempBuffer,(void *)0x1000,0x4000,__flags);
      if (sVar10 == 0) goto LAB_0014ad9a;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char*,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&responseData,
                 (const_iterator)
                 responseData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish,tempBuffer,tempBuffer + sVar10);
      if (!bVar3) {
        do {
          _Var11 = std::
                   __search<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char_const*,__gnu_cxx::__ops::_Iter_equal_to_iter>
                             (responseData.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              responseData.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish,crlf,&local_11b0);
          if (_Var11._M_current ==
              responseData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
              .super__Vector_impl_data._M_finish) break;
          line._M_dataplus._M_p = (pointer)&line.field_2;
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    ((string *)&line,
                     responseData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,_Var11._M_current);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::erase
                    (&responseData,
                     (const_iterator)
                     responseData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (const_iterator)(_Var11._M_current + 2));
          sVar5 = line._M_string_length;
          if (line._M_string_length == 0) {
            bVar3 = true;
          }
          else {
            cVar17 = (char)&line;
            if (bVar7) {
              parts.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              parts.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              parts.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              uVar15 = line._M_string_length + 1;
              uVar18 = 0;
              while (uVar18 < uVar15) {
                sVar12 = std::__cxx11::string::find(cVar17,0x20);
                if (sVar12 == 0xffffffffffffffff) {
                  sVar12 = sVar5;
                }
                if ((pointer)(sVar12 - uVar18) != (pointer)0x0) {
                  headerValue._M_dataplus._M_p = line._M_dataplus._M_p + uVar18;
                  local_10e8._M_dataplus._M_p = (pointer)(sVar12 - uVar18);
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<char_const*,unsigned_long>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &parts,(char **)&headerValue,(unsigned_long *)&local_10e8);
                }
                uVar18 = sVar12 + 1;
              }
              if (0x20 < (ulong)((long)parts.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)parts.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)) {
                iVar9 = std::__cxx11::stoi(parts.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start + 1,
                                           (size_t *)0x0,10);
                *(int *)this = iVar9;
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&parts);
            }
            else {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&this->scheme,&line);
              bVar7 = false;
              lVar13 = std::__cxx11::string::find(cVar17,0x3a);
              if (lVar13 == -1) goto LAB_0014aba8;
              std::__cxx11::string::substr((ulong)&parts,(ulong)&line);
              std::__cxx11::string::substr((ulong)&headerValue,(ulong)&line);
              _Var4 = headerValue._M_dataplus;
              _Var14 = std::
                       __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<http::Request::send(std::__cxx11::string_const&,std::vector<unsigned_char,std::allocator<unsigned_char>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::_lambda(int)_1_>>
                                 (headerValue._M_dataplus._M_p,
                                  headerValue._M_dataplus._M_p + headerValue._M_string_length);
              std::__cxx11::string::erase(&headerValue,_Var4._M_p,_Var14._M_current);
              local_10b0 = headerValue._M_dataplus._M_p + headerValue._M_string_length;
              local_10b8 = headerValue._M_dataplus._M_p;
              std::
              find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,http::Request::send(std::__cxx11::string_const&,std::vector<unsigned_char,std::allocator<unsigned_char>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::_lambda(int)_2_>
                        (&local_10e8,&local_10b0,&local_10b8);
              std::__cxx11::string::erase
                        (&headerValue,local_10e8._M_dataplus._M_p,
                         headerValue._M_dataplus._M_p + headerValue._M_string_length);
              bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&parts,"Content-Length");
              if (bVar7) {
                local_1120 = std::__cxx11::stoul(&headerValue,(size_t *)0x0,10);
                bVar8 = true;
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,
                           local_1120);
              }
              else {
                bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&parts,"Transfer-Encoding");
                if (bVar7) {
                  bVar7 = std::operator==(&headerValue,"chunked");
                  bVar6 = true;
                  if (!bVar7) {
                    this_01 = (ResponseError *)__cxa_allocate_exception(0x10);
                    std::operator+(&local_10e8,"Unsupported transfer encoding: ",&headerValue);
                    ResponseError::ResponseError(this_01,&local_10e8);
                    __cxa_throw(this_01,&ResponseError::typeinfo,std::runtime_error::~runtime_error)
                    ;
                  }
                }
              }
              std::__cxx11::string::~string((string *)&headerValue);
              std::__cxx11::string::~string((string *)&parts);
            }
            bVar7 = false;
          }
LAB_0014aba8:
          std::__cxx11::string::~string((string *)&line);
        } while (sVar5 != 0);
      }
    } while (!bVar3);
    if (bVar6) {
      do {
        while (local_1188 == 0) {
          if ((local_11b0 & 1) != 0) {
            if ((ulong)((long)responseData.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)responseData.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start) < 2) {
              local_11b0 = (uint)CONCAT71((int7)((ulong)responseData.
                                                                                                                
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 8),1)
              ;
              local_1188 = 0;
              goto LAB_0014a8b6;
            }
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::erase
                      (&responseData,
                       (const_iterator)
                       responseData.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       (const_iterator)
                       (responseData.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start + 2));
          }
          _Var11 = std::
                   __search<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char_const*,__gnu_cxx::__ops::_Iter_equal_to_iter>
                             (responseData.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              responseData.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish,crlf,&local_11b0);
          if (_Var11._M_current ==
              responseData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
              .super__Vector_impl_data._M_finish) {
            local_1188 = 0;
            local_11b0 = 0;
            goto LAB_0014a8b6;
          }
          line._M_dataplus._M_p = (pointer)&line.field_2;
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    ((string *)&line,
                     responseData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,_Var11._M_current);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::erase
                    (&responseData,
                     (const_iterator)
                     responseData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (const_iterator)(_Var11._M_current + 2));
          local_1188 = std::__cxx11::stoul(&line,(size_t *)0x0,0x10);
          std::__cxx11::string::~string((string *)&line);
          local_11b0 = 0;
          if (local_1188 == 0) goto LAB_0014ad9a;
        }
        uVar18 = (long)responseData.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)responseData.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
        uVar15 = local_1188;
        if (uVar18 < local_1188) {
          uVar15 = uVar18;
        }
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                  (this_00,(const_iterator)(this->domain)._M_dataplus._M_p,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )responseData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )(responseData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar15));
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::erase
                  (&responseData,
                   (const_iterator)
                   responseData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   (const_iterator)
                   (responseData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start + uVar15));
        uVar15 = local_1188 - uVar15;
        local_11b0 = CONCAT31((int3)(local_11b0 >> 8),(byte)local_11b0 | local_1188 <= uVar18);
        local_1188 = uVar15;
      } while (responseData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start !=
               responseData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish);
      goto LAB_0014a8b6;
    }
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              (this_00,(const_iterator)(this->domain)._M_dataplus._M_p,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )responseData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )responseData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
    if (responseData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        responseData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) {
      responseData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           responseData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    if ((bVar8) &&
       (local_1120 <=
        (ulong)((long)(this->domain)._M_dataplus._M_p - *(long *)((long)&(this->scheme).field_2 + 8)
               ))) {
LAB_0014ad9a:
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&responseData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      detail::Socket::~Socket(&socket);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&requestData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      std::__cxx11::string::~string((string *)&headerData);
      std::unique_ptr<addrinfo,_void_(*)(addrinfo_*)>::~unique_ptr(&addressInfo);
      return (ssize_t)this;
    }
  } while( true );
}

Assistant:

Response send(const std::string& method,
                      const std::vector<uint8_t>& body,
                      const std::vector<std::string>& headers)
        {
            if (scheme != "http")
                throw RequestError("Only HTTP scheme is supported");

            addrinfo hints = {};
            hints.ai_family = getAddressFamily(internetProtocol);
            hints.ai_socktype = SOCK_STREAM;

            addrinfo* info;
            if (getaddrinfo(domain.c_str(), port.c_str(), &hints, &info) != 0)
                throw std::system_error(getLastError(), std::system_category(), "Failed to get address info of " + domain);

            std::unique_ptr<addrinfo, decltype(&freeaddrinfo)> addressInfo(info, freeaddrinfo);

            std::string headerData = method + " " + path + " HTTP/1.1\r\n";

            for (const std::string& header : headers)
                headerData += header + "\r\n";

            headerData += "Host: " + domain + "\r\n"
                "Content-Length: " + std::to_string(body.size()) + "\r\n"
                "\r\n";

            std::vector<uint8_t> requestData(headerData.begin(), headerData.end());
            requestData.insert(requestData.end(), body.begin(), body.end());

            Socket socket(internetProtocol);

            // take the first address from the list
            socket.connect(addressInfo->ai_addr, static_cast<socklen_t>(addressInfo->ai_addrlen));

            auto remaining = requestData.size();
            auto sendData = requestData.data();

            // send the request
            while (remaining > 0)
            {
                const auto size = socket.send(sendData, remaining, noSignal);
                remaining -= size;
                sendData += size;
            }

            std::uint8_t tempBuffer[4096];
            constexpr std::uint8_t crlf[] = {'\r', '\n'};
            Response response;
            std::vector<std::uint8_t> responseData;
            bool firstLine = true;
            bool parsedHeaders = false;
            bool contentLengthReceived = false;
            unsigned long contentLength = 0;
            bool chunkedResponse = false;
            std::size_t expectedChunkSize = 0;
            bool removeCrlfAfterChunk = false;

            // read the response
            for (;;)
            {
                const auto size = socket.recv(tempBuffer, sizeof(tempBuffer), noSignal);

                if (size == 0)
                    break; // disconnected

                responseData.insert(responseData.end(), tempBuffer, tempBuffer + size);

                if (!parsedHeaders)
                    for (;;)
                    {
                        const auto i = std::search(responseData.begin(), responseData.end(), std::begin(crlf), std::end(crlf));

                        // didn't find a newline
                        if (i == responseData.end()) break;

                        const std::string line(responseData.begin(), i);
                        responseData.erase(responseData.begin(), i + 2);

                        // empty line indicates the end of the header section
                        if (line.empty())
                        {
                            parsedHeaders = true;
                            break;
                        }
                        else if (firstLine) // first line
                        {
                            firstLine = false;

                            std::string::size_type lastPos = 0;
                            const auto length = line.length();
                            std::vector<std::string> parts;

                            // tokenize first line
                            while (lastPos < length + 1)
                            {
                                auto pos = line.find(' ', lastPos);
                                if (pos == std::string::npos) pos = length;

                                if (pos != lastPos)
                                    parts.emplace_back(line.data() + lastPos,
                                                       static_cast<std::vector<std::string>::size_type>(pos) - lastPos);

                                lastPos = pos + 1;
                            }

                            if (parts.size() >= 2)
                                response.status = std::stoi(parts[1]);
                        }
                        else // headers
                        {
                            response.headers.push_back(line);

                            const auto pos = line.find(':');

                            if (pos != std::string::npos)
                            {
                                std::string headerName = line.substr(0, pos);
                                std::string headerValue = line.substr(pos + 1);

                                // ltrim
                                headerValue.erase(headerValue.begin(),
                                                  std::find_if(headerValue.begin(), headerValue.end(),
                                                               [](int c) {return !std::isspace(c);}));

                                // rtrim
                                headerValue.erase(std::find_if(headerValue.rbegin(), headerValue.rend(),
                                                               [](int c) {return !std::isspace(c);}).base(),
                                                  headerValue.end());

                                if (headerName == "Content-Length")
                                {
                                    contentLength = std::stoul(headerValue);
                                    contentLengthReceived = true;
                                    response.body.reserve(contentLength);
                                }
                                else if (headerName == "Transfer-Encoding")
                                {
                                    if (headerValue == "chunked")
                                        chunkedResponse = true;
                                    else
                                        throw ResponseError("Unsupported transfer encoding: " + headerValue);
                                }
                            }
                        }
                    }

                if (parsedHeaders)
                {
                    // Content-Length must be ignored if Transfer-Encoding is received
                    if (chunkedResponse)
                    {
                        bool dataReceived = false;
                        for (;;)
                        {
                            if (expectedChunkSize > 0)
                            {
                                const auto toWrite = std::min(expectedChunkSize, responseData.size());
                                response.body.insert(response.body.end(), responseData.begin(), responseData.begin() + static_cast<ptrdiff_t>(toWrite));
                                responseData.erase(responseData.begin(), responseData.begin() + static_cast<ptrdiff_t>(toWrite));
                                expectedChunkSize -= toWrite;

                                if (expectedChunkSize == 0) removeCrlfAfterChunk = true;
                                if (responseData.empty()) break;
                            }
                            else
                            {
                                if (removeCrlfAfterChunk)
                                {
                                    if (responseData.size() >= 2)
                                    {
                                        removeCrlfAfterChunk = false;
                                        responseData.erase(responseData.begin(), responseData.begin() + 2);
                                    }
                                    else break;
                                }

                                const auto i = std::search(responseData.begin(), responseData.end(), std::begin(crlf), std::end(crlf));

                                if (i == responseData.end()) break;

                                const std::string line(responseData.begin(), i);
                                responseData.erase(responseData.begin(), i + 2);

                                expectedChunkSize = std::stoul(line, nullptr, 16);

                                if (expectedChunkSize == 0)
                                {
                                    dataReceived = true;
                                    break;
                                }
                            }
                        }

                        if (dataReceived)
                            break;
                    }
                    else
                    {
                        response.body.insert(response.body.end(), responseData.begin(), responseData.end());
                        responseData.clear();

                        // got the whole content
                        if (contentLengthReceived && response.body.size() >= contentLength)
                            break;
                    }
                }
            }

            return response;
        }